

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

GPU_ShaderBlock load_shader_program(Uint32 *p,char *vertex_shader_file,char *fragment_shader_file)

{
  Uint32 UVar1;
  Uint32 shader_object2;
  char *pcVar2;
  Uint32 f;
  Uint32 v;
  char *fragment_shader_file_local;
  char *vertex_shader_file_local;
  Uint32 *p_local;
  GPU_ShaderBlock b;
  
  UVar1 = load_shader(GPU_VERTEX_SHADER,vertex_shader_file);
  if (UVar1 == 0) {
    pcVar2 = GPU_GetShaderMessage();
    GPU_LogError("Failed to load vertex shader (%s): %s\n",vertex_shader_file,pcVar2);
  }
  shader_object2 = load_shader(GPU_FRAGMENT_SHADER,fragment_shader_file);
  if (shader_object2 == 0) {
    pcVar2 = GPU_GetShaderMessage();
    GPU_LogError("Failed to load fragment shader (%s): %s\n",fragment_shader_file,pcVar2);
  }
  UVar1 = GPU_LinkShaders(UVar1,shader_object2);
  *p = UVar1;
  if (*p == 0) {
    b.position_loc = -1;
    b.texcoord_loc = -1;
    p_local = (Uint32 *)0xffffffffffffffff;
    pcVar2 = GPU_GetShaderMessage();
    GPU_LogError("Failed to link shader program (%s + %s): %s\n",vertex_shader_file,
                 fragment_shader_file,pcVar2);
  }
  else {
    _p_local = GPU_LoadShaderBlock(*p,"gpu_Vertex","gpu_TexCoord","gpu_Color",
                                   "gpu_ModelViewProjectionMatrix");
    GPU_ActivateShaderProgram(*p,(GPU_ShaderBlock *)&p_local);
  }
  return _p_local;
}

Assistant:

GPU_ShaderBlock load_shader_program(Uint32* p, const char* vertex_shader_file, const char* fragment_shader_file)
{
    Uint32 v, f;
    v = load_shader(GPU_VERTEX_SHADER, vertex_shader_file);
    
    if(!v)
        GPU_LogError("Failed to load vertex shader (%s): %s\n", vertex_shader_file, GPU_GetShaderMessage());
    
    f = load_shader(GPU_FRAGMENT_SHADER, fragment_shader_file);
    
    if(!f)
        GPU_LogError("Failed to load fragment shader (%s): %s\n", fragment_shader_file, GPU_GetShaderMessage());
    
    *p = GPU_LinkShaders(v, f);
    
    if(!*p)
    {
		GPU_ShaderBlock b = {-1, -1, -1, -1};
        GPU_LogError("Failed to link shader program (%s + %s): %s\n", vertex_shader_file, fragment_shader_file, GPU_GetShaderMessage());
        return b;
    }
    
	{
		GPU_ShaderBlock block = GPU_LoadShaderBlock(*p, "gpu_Vertex", "gpu_TexCoord", "gpu_Color", "gpu_ModelViewProjectionMatrix");
		GPU_ActivateShaderProgram(*p, &block);

		return block;
	}
}